

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

int lws_vbi_encode(uint64_t value,void *buf)

{
  bool bVar1;
  long lVar2;
  byte bVar3;
  uint8_t *p;
  
  if (value < 0x10000000) {
    lVar2 = 0;
    do {
      bVar3 = (byte)value | 0x80;
      if (value < 0x80) {
        bVar3 = (byte)value;
      }
      *(byte *)((long)buf + lVar2) = bVar3;
      lVar2 = lVar2 + 1;
      bVar1 = 0x7f < value;
      value = value >> 7;
    } while (bVar1);
    return (int)lVar2;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/libwebsockets.c"
                ,0x4e,"int lws_vbi_encode(uint64_t, void *)");
}

Assistant:

int
lws_vbi_encode(uint64_t value, void *buf)
{
	uint8_t *p = (uint8_t *)buf, b;

	if (value > 0xfffffff) {
		assert(0);
		return -1;
	}

	do {
		b = value & 0x7f;
		value >>= 7;
		if (value)
			*p++ = (0x80 | b);
		else
			*p++ = b;
	} while (value);

	return lws_ptr_diff(p, buf);
}